

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ProcessRTCPCompoundPacket
          (RTPSources *this,RTCPCompoundPacket *rtcpcomppack,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  RTPInternalSourceData *pRVar4;
  RTCPSDESPacket *this_00;
  byte *pbVar5;
  bool bVar6;
  int iVar7;
  int32_t iVar8;
  ItemType t;
  _Self __tmp;
  _List_node_base *p_Var9;
  long lVar10;
  uint8_t *puVar11;
  size_t sVar12;
  size_t valuelen;
  uint8_t *valuedata;
  uint uVar13;
  RTCPBYEPacket *p;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint8_t uVar17;
  ulong uVar18;
  uint32_t uVar19;
  uint local_6c;
  uint local_54;
  RTPNTPTime local_38;
  
  pRVar4 = this->owndata;
  if (pRVar4 == (RTPInternalSourceData *)0x0) {
    local_6c = 0;
  }
  else {
    local_6c = (pRVar4->super_RTPSourceData).ssrc;
  }
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
            (this,rtcpcomppack,receivetime,senderaddress);
  p_Var9 = (rtcpcomppack->rtcppacklist).
           super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (rtcpcomppack->rtcppackit)._M_node = p_Var9;
LAB_00124adb:
  if (p_Var9 == (_List_node_base *)&rtcpcomppack->rtcppacklist) {
    return 0;
  }
  this_00 = (RTCPSDESPacket *)p_Var9[1]._M_next;
  (rtcpcomppack->rtcppackit)._M_node = p_Var9->_M_next;
  if (this_00 == (RTCPSDESPacket *)0x0) {
    return 0;
  }
  lVar10 = 0x88;
  if ((this_00->super_RTCPPacket).knownformat != true) goto switchD_00124b27_caseD_4;
  lVar10 = 0x78;
  switch((this_00->super_RTCPPacket).packettype) {
  case SR:
    uVar13 = *(uint *)((this_00->super_RTCPPacket).data + 4);
    local_38 = RTCPSRPacket::GetNTPTimestamp((RTCPSRPacket *)this_00);
    uVar14 = 0;
    uVar19 = 0;
    uVar15 = 0;
    if ((this_00->super_RTCPPacket).knownformat == true) {
      puVar11 = (this_00->super_RTCPPacket).data;
      uVar3 = *(uint *)(puVar11 + 0x10);
      uVar2 = *(uint *)(puVar11 + 0x14);
      uVar19 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar14 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar3 = *(uint *)(puVar11 + 0x18);
      uVar15 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
    local_54 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    iVar7 = ProcessRTCPSenderInfo
                      (this,local_54,&local_38,uVar19,uVar14,uVar15,receivetime,senderaddress);
    if (iVar7 < 0) {
      return iVar7;
    }
    if (pRVar4 != (RTPInternalSourceData *)0x0) {
      if ((this_00->super_RTCPPacket).knownformat == true) {
        uVar13 = *(this_00->super_RTCPPacket).data & 0x1f;
      }
      else {
        uVar13 = 0;
      }
      lVar10 = 0;
      bVar6 = false;
      for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
        if ((this_00->super_RTCPPacket).knownformat == true) {
          puVar11 = (this_00->super_RTCPPacket).data;
          uVar3 = *(uint *)(puVar11 + lVar10 + 0x1c);
          if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ==
              local_6c) {
            uVar17 = puVar11[lVar10 + 0x20];
LAB_00124e7b:
            iVar8 = RTCPSRPacket::GetLostPacketCount((RTCPSRPacket *)this_00,(int)uVar18);
            uVar15 = 0;
            uVar19 = 0;
            uVar14 = 0;
            uVar16 = 0;
            if ((this_00->super_RTCPPacket).knownformat == true) {
              puVar11 = (this_00->super_RTCPPacket).data;
              uVar3 = *(uint *)(puVar11 + lVar10 + 0x24);
              uVar2 = *(uint *)(puVar11 + lVar10 + 0x28);
              uVar19 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
              uVar14 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
              uVar3 = *(uint *)(puVar11 + lVar10 + 0x2c);
              uVar15 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
              uVar3 = *(uint *)(puVar11 + lVar10 + 0x30);
              uVar16 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
            }
            iVar7 = ProcessRTCPReportBlock
                              (this,local_54,uVar17,iVar8,uVar19,uVar14,uVar15,uVar16,receivetime,
                               senderaddress);
            bVar6 = true;
            if (iVar7 < 0) {
              return iVar7;
            }
          }
        }
        else if (local_6c == 0) {
          uVar17 = '\0';
          goto LAB_00124e7b;
        }
        lVar10 = lVar10 + 0x18;
      }
LAB_00124efd:
      if (bVar6) break;
    }
    goto LAB_00124f06;
  case RR:
    pbVar5 = (this_00->super_RTCPPacket).data;
    uVar13 = *(uint *)(pbVar5 + 4);
    local_54 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    if (pRVar4 != (RTPInternalSourceData *)0x0) {
      bVar1 = *pbVar5;
      lVar10 = 0;
      bVar6 = false;
      for (uVar18 = 0; (bVar1 & 0x1f) != uVar18; uVar18 = uVar18 + 1) {
        if ((this_00->super_RTCPPacket).knownformat == true) {
          puVar11 = (this_00->super_RTCPPacket).data;
          uVar13 = *(uint *)(puVar11 + lVar10 + 8);
          if ((uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18)
              == local_6c) {
            uVar17 = puVar11[lVar10 + 0xc];
LAB_00124c7e:
            iVar8 = RTCPRRPacket::GetLostPacketCount((RTCPRRPacket *)this_00,(int)uVar18);
            uVar15 = 0;
            uVar19 = 0;
            uVar14 = 0;
            uVar16 = 0;
            if ((this_00->super_RTCPPacket).knownformat == true) {
              puVar11 = (this_00->super_RTCPPacket).data;
              uVar13 = *(uint *)(puVar11 + lVar10 + 0x10);
              uVar3 = *(uint *)(puVar11 + lVar10 + 0x14);
              uVar19 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18;
              uVar14 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
              uVar13 = *(uint *)(puVar11 + lVar10 + 0x18);
              uVar15 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18;
              uVar13 = *(uint *)(puVar11 + lVar10 + 0x1c);
              uVar16 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18;
            }
            iVar7 = ProcessRTCPReportBlock
                              (this,local_54,uVar17,iVar8,uVar19,uVar14,uVar15,uVar16,receivetime,
                               senderaddress);
            bVar6 = true;
            if (iVar7 < 0) {
              return iVar7;
            }
          }
        }
        else if (local_6c == 0) {
          uVar17 = '\0';
          goto LAB_00124c7e;
        }
        lVar10 = lVar10 + 0x18;
      }
      goto LAB_00124efd;
    }
LAB_00124f06:
    iVar7 = UpdateReceiveTime(this,local_54,receivetime,senderaddress);
    if (iVar7 < 0) {
      return iVar7;
    }
    break;
  case SDES:
    bVar6 = RTCPSDESPacket::GotoFirstChunk(this_00);
    while (bVar6 != false) {
      uVar19 = 0;
      if (((this_00->super_RTCPPacket).knownformat == true) &&
         ((uint *)this_00->currentchunk != (uint *)0x0)) {
        uVar13 = *(uint *)this_00->currentchunk;
        uVar19 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
      }
      bVar6 = RTCPSDESPacket::GotoFirstItem(this_00);
      if (bVar6) {
        do {
          t = RTCPSDESPacket::GetItemType(this_00);
          if (t == PRIV) {
            sVar12 = RTCPSDESPacket::GetPRIVPrefixLength(this_00);
            puVar11 = RTCPSDESPacket::GetPRIVPrefixData(this_00);
            valuelen = RTCPSDESPacket::GetPRIVValueLength(this_00);
            valuedata = RTCPSDESPacket::GetPRIVValueData(this_00);
            iVar7 = ProcessSDESPrivateItem
                              (this,uVar19,sVar12,puVar11,valuelen,valuedata,receivetime,
                               senderaddress);
          }
          else {
            sVar12 = RTCPSDESPacket::GetItemLength(this_00);
            puVar11 = RTCPSDESPacket::GetItemData(this_00);
            iVar7 = ProcessSDESNormalItem(this,uVar19,t,sVar12,puVar11,receivetime,senderaddress);
          }
          if (iVar7 < 0) {
            return iVar7;
          }
          bVar6 = RTCPSDESPacket::GotoNextItem(this_00);
        } while (bVar6);
      }
      else {
        iVar7 = UpdateReceiveTime(this,uVar19,receivetime,senderaddress);
        if (iVar7 < 0) {
          return iVar7;
        }
      }
      bVar6 = RTCPSDESPacket::GotoNextChunk(this_00);
    }
    break;
  case BYE:
    bVar1 = *(this_00->super_RTCPPacket).data;
    uVar18 = 0;
    while ((bVar1 & 0x1f) != uVar18) {
      if ((this_00->super_RTCPPacket).knownformat == true) {
        puVar11 = (this_00->super_RTCPPacket).data;
        uVar13 = *(uint *)(puVar11 + uVar18 * 4 + 4);
        uVar19 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
        if (this_00->currentchunk == (uint8_t *)0x0) goto LAB_00124bf1;
        sVar12 = (size_t)puVar11[(long)this_00->currentchunk];
      }
      else {
        uVar19 = 0;
LAB_00124bf1:
        sVar12 = 0;
      }
      puVar11 = RTCPBYEPacket::GetReasonData((RTCPBYEPacket *)this_00);
      iVar7 = ProcessBYE(this,uVar19,sVar12,puVar11,receivetime,senderaddress);
      uVar18 = uVar18 + 1;
      if (iVar7 < 0) {
        return iVar7;
      }
    }
    break;
  case APP:
    goto switchD_00124b27_caseD_4;
  default:
    lVar10 = 0x80;
    goto switchD_00124b27_caseD_4;
  }
LAB_00124e2f:
  p_Var9 = (rtcpcomppack->rtcppackit)._M_node;
  goto LAB_00124adb;
switchD_00124b27_caseD_4:
  (**(code **)((long)(this->super_RTPMemoryObject)._vptr_RTPMemoryObject + lVar10))
            (this,this_00,receivetime,senderaddress);
  goto LAB_00124e2f;
}

Assistant:

int RTPSources::ProcessRTCPCompoundPacket(RTCPCompoundPacket *rtcpcomppack,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTCPPacket *rtcppack;
	int status;
	bool gotownssrc = ((owndata == 0)?false:true);
	uint32_t ownssrc = ((owndata != 0)?owndata->GetSSRC():0);
	
	OnRTCPCompoundPacket(rtcpcomppack,receivetime,senderaddress);
	
	rtcpcomppack->GotoFirstPacket();	
	while ((rtcppack = rtcpcomppack->GetNextPacket()) != 0)
	{
		if (rtcppack->IsKnownFormat())
		{
			switch (rtcppack->GetPacketType())
			{
			case RTCPPacket::SR:
				{
					RTCPSRPacket *p = (RTCPSRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					status = ProcessRTCPSenderInfo(senderssrc,p->GetNTPTimestamp(),p->GetRTPTimestamp(),
						                       p->GetSenderPacketCount(),p->GetSenderOctetCount(),
								       receivetime,senderaddress);
					if (status < 0)
						return status;
					
					bool gotinfo = false;
					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc) // data is meant for us
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::RR:
				{
					RTCPRRPacket *p = (RTCPRRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					bool gotinfo = false;

					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc)
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::SDES:
				{
					RTCPSDESPacket *p = (RTCPSDESPacket *)rtcppack;
					
					if (p->GotoFirstChunk())
					{
						do
						{
							uint32_t sdesssrc = p->GetChunkSSRC();
							bool updated = false;
							if (p->GotoFirstItem())
							{
								do
								{
									RTCPSDESPacket::ItemType t;
				
									if ((t = p->GetItemType()) != RTCPSDESPacket::PRIV)
									{
										updated = true;
										status = ProcessSDESNormalItem(sdesssrc,t,p->GetItemLength(),p->GetItemData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#ifdef RTP_SUPPORT_SDESPRIV
									else
									{
										updated = true;
										status = ProcessSDESPrivateItem(sdesssrc,p->GetPRIVPrefixLength(),p->GetPRIVPrefixData(),p->GetPRIVValueLength(),
												                        p->GetPRIVValueData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#endif // RTP_SUPPORT_SDESPRIV
								} while (p->GotoNextItem());
							}
							if (!updated)
							{
								status = UpdateReceiveTime(sdesssrc,receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						} while (p->GotoNextChunk());
					}
				}
				break;
			case RTCPPacket::BYE:
				{
					RTCPBYEPacket *p = (RTCPBYEPacket *)rtcppack;
					int i;
					int num = p->GetSSRCCount();

					for (i = 0 ; i < num ; i++)
					{
						uint32_t byessrc = p->GetSSRC(i);
						status = ProcessBYE(byessrc,p->GetReasonLength(),p->GetReasonData(),receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::APP:
				{
					RTCPAPPPacket *p = (RTCPAPPPacket *)rtcppack;

					OnAPPPacket(p,receivetime,senderaddress);
				}
				break; 
			case RTCPPacket::Unknown:
			default:
				{
					OnUnknownPacketType(rtcppack,receivetime,senderaddress);
				}
				break;
			}
		}
		else
		{
			OnUnknownPacketFormat(rtcppack,receivetime,senderaddress);
		}
	}

	return 0;
}